

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml2-py.c
# Opt level: O0

PyObject * libxml_xmlValidCtxtNormalizeAttributeValue(PyObject *self,PyObject *args)

{
  int iVar1;
  PyObject *local_88;
  PyObject *local_80;
  PyObject *local_78;
  undefined8 local_70;
  xmlChar *value;
  xmlChar *name;
  PyObject *pyobj_elem;
  xmlNodePtr elem;
  PyObject *pyobj_doc;
  xmlDocPtr doc;
  PyObject *pyobj_ctxt;
  xmlValidCtxtPtr ctxt;
  xmlChar *c_retval;
  PyObject *py_retval;
  PyObject *args_local;
  PyObject *self_local;
  
  py_retval = args;
  args_local = self;
  iVar1 = libxml_deprecationWarning("xmlValidCtxtNormalizeAttributeValue");
  if (iVar1 == -1) {
    self_local = (PyObject *)0x0;
  }
  else {
    iVar1 = _PyArg_ParseTuple_SizeT
                      (py_retval,"OOOzz:xmlValidCtxtNormalizeAttributeValue",&doc,&elem,&name,&value
                       ,&local_70);
    if (iVar1 == 0) {
      self_local = (PyObject *)0x0;
    }
    else {
      if (doc == (xmlDocPtr)&_Py_NoneStruct) {
        local_78 = (PyObject *)0x0;
      }
      else {
        local_78 = (PyObject *)doc->name;
      }
      pyobj_ctxt = local_78;
      if (elem == (xmlNodePtr)&_Py_NoneStruct) {
        local_80 = (PyObject *)0x0;
      }
      else {
        local_80 = (PyObject *)elem->name;
      }
      pyobj_doc = local_80;
      if (name == &_Py_NoneStruct) {
        local_88 = (PyObject *)0x0;
      }
      else {
        local_88 = *(PyObject **)(name + 0x10);
      }
      pyobj_elem = local_88;
      ctxt = (xmlValidCtxtPtr)
             xmlValidCtxtNormalizeAttributeValue(local_78,local_80,local_88,value,local_70);
      self_local = libxml_xmlCharPtrWrap((xmlChar *)ctxt);
    }
  }
  return self_local;
}

Assistant:

XML_IGNORE_DEPRECATION_WARNINGS
PyObject *
libxml_xmlValidCtxtNormalizeAttributeValue(PyObject *self ATTRIBUTE_UNUSED, PyObject *args) {
    PyObject *py_retval;
    xmlChar * c_retval;
    xmlValidCtxtPtr ctxt;
    PyObject *pyobj_ctxt;
    xmlDocPtr doc;
    PyObject *pyobj_doc;
    xmlNodePtr elem;
    PyObject *pyobj_elem;
    xmlChar * name;
    xmlChar * value;

    if (libxml_deprecationWarning("xmlValidCtxtNormalizeAttributeValue") == -1)
        return(NULL);

    if (!PyArg_ParseTuple(args, (char *)"OOOzz:xmlValidCtxtNormalizeAttributeValue", &pyobj_ctxt, &pyobj_doc, &pyobj_elem, &name, &value))
        return(NULL);
    ctxt = (xmlValidCtxtPtr) PyValidCtxt_Get(pyobj_ctxt);
    doc = (xmlDocPtr) PyxmlNode_Get(pyobj_doc);
    elem = (xmlNodePtr) PyxmlNode_Get(pyobj_elem);

    c_retval = xmlValidCtxtNormalizeAttributeValue(ctxt, doc, elem, name, value);
    py_retval = libxml_xmlCharPtrWrap((xmlChar *) c_retval);
    return(py_retval);
}